

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMCharacterDataImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DOMCharacterDataImpl::appendData
          (DOMCharacterDataImpl *this,DOMNode *node,XMLCh *dat,XMLSize_t n)

{
  DOMNodeImpl *pDVar1;
  DOMException *this_00;
  MemoryManager **ppMVar2;
  
  pDVar1 = castToNodeImpl(node);
  if ((pDVar1->flags & 1) == 0) {
    DOMBuffer::append(this->fDataBuf,dat,n);
    return;
  }
  this_00 = (DOMException *)__cxa_allocate_exception(0x28);
  if (this->fDoc == (DOMDocumentImpl *)0x0) {
    ppMVar2 = (MemoryManager **)&XMLPlatformUtils::fgMemoryManager;
  }
  else {
    ppMVar2 = &this->fDoc->fMemoryManager;
  }
  DOMException::DOMException(this_00,7,0,*ppMVar2);
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void DOMCharacterDataImpl::appendData(const DOMNode *node, const  XMLCh *dat, XMLSize_t n)
{
    if(castToNodeImpl(node)->isReadOnly())
        throw DOMException(
        DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMCharacterDataImplMemoryManager);

    fDataBuf->append(dat, n);
}